

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O0

void __thiscall test::FunctionTimer::EndCall(FunctionTimer *this)

{
  uint64_t uVar1;
  long in_RDI;
  uint64_t t1;
  
  if (*(long *)(in_RDI + 0x28) != 0) {
    uVar1 = tonk_time();
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
    *(uint64_t *)(in_RDI + 0x38) = (uVar1 - *(long *)(in_RDI + 0x28)) + *(long *)(in_RDI + 0x38);
    *(undefined8 *)(in_RDI + 0x28) = 0;
    std::mutex::unlock((mutex *)0x11d622);
    return;
  }
  __assert_fail("t0 != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/tests/TonkTestTools.cpp"
                ,0x48,"void test::FunctionTimer::EndCall()");
}

Assistant:

void FunctionTimer::EndCall()
{
    assert(t0 != 0);
    uint64_t t1 = tonk_time();
    ++Invokations;
    TotalUsec += t1 - t0;
    t0 = 0;
    CallLock.unlock();
}